

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_tests.cpp
# Opt level: O0

void __thiscall allocator_tests::lockedpool_tests_mock::test_method(lockedpool_tests_mock *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  void *a6;
  void *invalid_toobig;
  void *invalid_toosmall;
  void *a5;
  void *a4;
  void *a3;
  void *a2;
  void *a1;
  void *a0;
  LockedPool pool;
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> x;
  LockedPool *in_stack_fffffffffffff218;
  undefined7 in_stack_fffffffffffff220;
  undefined1 in_stack_fffffffffffff227;
  LockedPool *in_stack_fffffffffffff228;
  LockedPool *in_stack_fffffffffffff238;
  const_string *in_stack_fffffffffffff240;
  const_string *msg;
  undefined7 in_stack_fffffffffffff248;
  undefined1 in_stack_fffffffffffff24f;
  lazy_ostream *in_stack_fffffffffffff250;
  unit_test_log_t *in_stack_fffffffffffff258;
  const_string *this_00;
  size_t in_stack_fffffffffffff270;
  undefined7 in_stack_fffffffffffff278;
  undefined1 in_stack_fffffffffffff27f;
  const_string local_b78 [2];
  lazy_ostream local_b58 [5];
  assertion_result local_b08 [2];
  const_string local_ad0 [2];
  lazy_ostream local_ab0 [5];
  assertion_result local_a60 [2];
  const_string local_a28 [2];
  lazy_ostream local_a08 [5];
  assertion_result local_9b8 [2];
  const_string local_980 [2];
  lazy_ostream local_960 [2];
  assertion_result local_940 [2];
  const_string local_908 [2];
  lazy_ostream local_8e8 [2];
  assertion_result local_8c8 [2];
  void *local_890;
  const_string local_888 [2];
  lazy_ostream local_868 [2];
  assertion_result local_848 [2];
  void *local_810;
  const_string local_808 [2];
  lazy_ostream local_7e8 [2];
  assertion_result local_7c8 [2];
  void *local_790;
  const_string local_788 [2];
  lazy_ostream local_768 [2];
  assertion_result local_748 [2];
  void *local_710;
  const_string local_708 [2];
  lazy_ostream local_6e8 [2];
  assertion_result local_6c8 [2];
  void *local_690;
  const_string local_688 [2];
  lazy_ostream local_668 [5];
  assertion_result local_618 [2];
  const_string local_5e0 [2];
  lazy_ostream local_5c0 [2];
  assertion_result local_5a0 [2];
  void *local_568;
  const_string local_560 [2];
  lazy_ostream local_540 [5];
  assertion_result local_4f0 [2];
  const_string local_4b8 [2];
  lazy_ostream local_498 [5];
  assertion_result local_448 [2];
  const_string local_410 [2];
  lazy_ostream local_3f0 [2];
  assertion_result local_3d0 [2];
  const_string local_398 [2];
  lazy_ostream local_378 [5];
  assertion_result local_328 [2];
  const_string local_2f0 [2];
  lazy_ostream local_2d0 [5];
  assertion_result local_280 [2];
  const_string local_248 [2];
  lazy_ostream local_228 [2];
  assertion_result local_208 [2];
  const_string local_1d0 [2];
  lazy_ostream local_1b0 [5];
  assertion_result local_160 [2];
  const_string local_128 [2];
  lazy_ostream local_108 [5];
  assertion_result local_b8 [2];
  LockedPool local_78;
  undefined4 local_20;
  undefined4 local_1c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1c = 3;
  local_20 = 1;
  std::make_unique<allocator_tests::TestLockedPageAllocator,int,int>
            ((int *)in_stack_fffffffffffff250,
             (int *)CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248));
  std::unique_ptr<LockedPageAllocator,std::default_delete<LockedPageAllocator>>::
  unique_ptr<allocator_tests::TestLockedPageAllocator,std::default_delete<allocator_tests::TestLockedPageAllocator>,void>
            (&in_stack_fffffffffffff228->allocator,
             (unique_ptr<allocator_tests::TestLockedPageAllocator,_std::default_delete<allocator_tests::TestLockedPageAllocator>_>
              *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
  std::
  unique_ptr<allocator_tests::TestLockedPageAllocator,_std::default_delete<allocator_tests::TestLockedPageAllocator>_>
  ::~unique_ptr((unique_ptr<allocator_tests::TestLockedPageAllocator,_std::default_delete<allocator_tests::TestLockedPageAllocator>_>
                 *)in_stack_fffffffffffff228);
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::unique_ptr
            (&in_stack_fffffffffffff218->allocator,
             (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)0x358ba6)
  ;
  LockedPool::LockedPool
            (in_stack_fffffffffffff228,
             (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)
             CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
             (LockingFailed_Callback)in_stack_fffffffffffff218);
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::~unique_ptr
            (&in_stack_fffffffffffff228->allocator);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b8,local_108,local_128,0xab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_160,local_1b0,local_1d0,0xac,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::alloc((LockedPool *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                    in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_208,local_228,local_248,0xb0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_280,local_2d0,local_2f0,0xb1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_328,local_378,local_398,0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::alloc((LockedPool *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                    in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3d0,local_3f0,local_410,0xb4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_448,local_498,local_4b8,0xb5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_540,local_560,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_568 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5a0,local_5c0,local_5e0,0xb9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_618,local_668,local_688,0xba,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_690 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6c8,local_6e8,local_708,0xbc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_710 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_748,local_768,local_788,0xbe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_790 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7c8,local_7e8,local_808,0xc0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_810 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_848,local_868,local_888,0xc2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_890 = LockedPool::alloc((LockedPool *)
                                CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                                in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result<void*>
              ((assertion_result *)in_stack_fffffffffffff228,
               (void **)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8c8,local_8e8,local_908,0xc4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::alloc((LockedPool *)CONCAT17(in_stack_fffffffffffff27f,in_stack_fffffffffffff278),
                    in_stack_fffffffffffff270);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_940,local_960,local_980,199,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::free(&local_78,local_568);
  LockedPool::free(&local_78,local_710);
  LockedPool::free(&local_78,local_810);
  LockedPool::free(&local_78,local_690);
  LockedPool::free(&local_78,local_790);
  LockedPool::free(&local_78,local_890);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff258,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9b8,local_a08,local_a28,0xcf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),
               in_stack_fffffffffffff240);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    in_stack_fffffffffffff250 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a60,local_ab0,local_ad0,0xd0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    in_stack_fffffffffffff24f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff24f);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)in_stack_fffffffffffff250,
               CONCAT17(in_stack_fffffffffffff24f,in_stack_fffffffffffff248),msg);
    LockedPool::stats(in_stack_fffffffffffff238);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff228,(bool)in_stack_fffffffffffff227);
    in_stack_fffffffffffff238 = (LockedPool *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (basic_cstring<const_char> *)in_stack_fffffffffffff218);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff228,
               (pointer)CONCAT17(in_stack_fffffffffffff227,in_stack_fffffffffffff220),
               (unsigned_long)in_stack_fffffffffffff218);
    in_stack_fffffffffffff218 = (LockedPool *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b08,local_b58,local_b78,0xd1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff218);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff218);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  LockedPool::~LockedPool(in_stack_fffffffffffff218);
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::~unique_ptr
            (&in_stack_fffffffffffff228->allocator);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(lockedpool_tests_mock)
{
    // Test over three virtual arenas, of which one will succeed being locked
    std::unique_ptr<LockedPageAllocator> x = std::make_unique<TestLockedPageAllocator>(3, 1);
    LockedPool pool(std::move(x));
    BOOST_CHECK(pool.stats().total == 0);
    BOOST_CHECK(pool.stats().locked == 0);

    // Ensure unreasonable requests are refused without allocating anything
    void *invalid_toosmall = pool.alloc(0);
    BOOST_CHECK(invalid_toosmall == nullptr);
    BOOST_CHECK(pool.stats().used == 0);
    BOOST_CHECK(pool.stats().free == 0);
    void *invalid_toobig = pool.alloc(LockedPool::ARENA_SIZE+1);
    BOOST_CHECK(invalid_toobig == nullptr);
    BOOST_CHECK(pool.stats().used == 0);
    BOOST_CHECK(pool.stats().free == 0);

    void *a0 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a0);
    BOOST_CHECK(pool.stats().locked == LockedPool::ARENA_SIZE);
    void *a1 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a1);
    void *a2 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a2);
    void *a3 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a3);
    void *a4 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a4);
    void *a5 = pool.alloc(LockedPool::ARENA_SIZE / 2);
    BOOST_CHECK(a5);
    // We've passed a count of three arenas, so this allocation should fail
    void *a6 = pool.alloc(16);
    BOOST_CHECK(!a6);

    pool.free(a0);
    pool.free(a2);
    pool.free(a4);
    pool.free(a1);
    pool.free(a3);
    pool.free(a5);
    BOOST_CHECK(pool.stats().total == 3*LockedPool::ARENA_SIZE);
    BOOST_CHECK(pool.stats().locked == LockedPool::ARENA_SIZE);
    BOOST_CHECK(pool.stats().used == 0);
}